

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLMATHOLD_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double in_stack_000003f0;
  double *in_stack_000003f8;
  double *in_stack_00000400;
  double *in_stack_00000408;
  double *in_stack_00000410;
  int in_stack_0000041c;
  int in_stack_00000420;
  int *in_stack_00000430;
  int *in_stack_00000438;
  int *in_stack_00000440;
  
  TVar1 = TA_CDLMATHOLD(in_stack_00000420,in_stack_0000041c,in_stack_00000410,in_stack_00000408,
                        in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_00000430,
                        in_stack_00000438,in_stack_00000440);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLMATHOLD_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLMATHOLD(
/* Generated */                    startIdx,
/* Generated */                    endIdx,
/* Generated */                    params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                    params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                    params->in[0].data.inPrice.low, /* inLow */
/* Generated */                    params->in[0].data.inPrice.close, /* inClose */
/* Generated */                    params->optIn[0].data.optInReal, /* optInPenetration*/
/* Generated */                    outBegIdx, 
/* Generated */                    outNBElement, 
/* Generated */                    params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }